

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

int32_t inform_encode(int *state,size_t n,int b,inform_error *err)

{
  double dVar1;
  undefined1 auVar2 [16];
  int local_38;
  int local_34;
  int32_t i;
  int32_t encoding;
  inform_error *err_local;
  int b_local;
  size_t n_local;
  int *state_local;
  
  if ((state == (int *)0x0) || (n == 0)) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_EARG;
    }
    state_local._4_4_ = -1;
  }
  else if (b < 2) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_EBASE;
    }
    state_local._4_4_ = -1;
  }
  else {
    auVar2._8_4_ = (int)(n >> 0x20);
    auVar2._0_8_ = n;
    auVar2._12_4_ = 0x45300000;
    dVar1 = log2((double)b);
    if (((auVar2._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0)) * dVar1 <= 31.0) {
      local_34 = 0;
      for (local_38 = 0; local_38 < (int)n; local_38 = local_38 + 1) {
        if (b <= state[local_38]) {
          if (err != (inform_error *)0x0) {
            *err = INFORM_EENCODE;
          }
          return -1;
        }
        local_34 = state[local_38] + b * local_34;
      }
      state_local._4_4_ = local_34;
    }
    else {
      if (err != (inform_error *)0x0) {
        *err = INFORM_EENCODE;
      }
      state_local._4_4_ = -1;
    }
  }
  return state_local._4_4_;
}

Assistant:

int32_t inform_encode(int const *state, size_t n, int b, inform_error *err)
{
    if (state == NULL || n == 0)
        INFORM_ERROR_RETURN(err, INFORM_EARG, -1);
    else if (b < 2)
        INFORM_ERROR_RETURN(err, INFORM_EBASE, -1);
    else if (n * log2(b) > 31)
        INFORM_ERROR_RETURN(err, INFORM_EENCODE, -1);

    int32_t encoding = 0;
    for (int32_t i = 0; i < (int32_t) n; ++i)
    {
        if (b <= state[i])
            INFORM_ERROR_RETURN(err, INFORM_EENCODE, -1);
        encoding *= b;
        encoding += state[i];
    }
    return encoding;
}